

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_gcc.cc
# Opt level: O1

void ScaleRowDown4Box_SSSE3(uint8_t *src_ptr,ptrdiff_t src_stride,uint8_t *dst_ptr,int dst_width)

{
  bool bVar1;
  undefined1 auVar2 [16];
  undefined1 *puVar3;
  undefined1 (*pauVar4) [16];
  int iVar5;
  ushort uVar6;
  ushort uVar9;
  ushort uVar10;
  ushort uVar11;
  ushort uVar12;
  ushort uVar13;
  ushort uVar14;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ushort uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  
  auVar24[8] = 1;
  auVar24._0_8_ = 0x1000100010001;
  auVar24[9] = 0;
  auVar24[10] = 1;
  auVar24[0xb] = 0;
  auVar24[0xc] = 1;
  auVar24[0xd] = 0;
  auVar24[0xe] = 1;
  auVar24[0xf] = 0;
  auVar24 = psllw(auVar24,3);
  do {
    auVar7[8] = 1;
    auVar7._0_8_ = 0x101010101010101;
    auVar7[9] = 1;
    auVar7[10] = 1;
    auVar7[0xb] = 1;
    auVar7[0xc] = 1;
    auVar7[0xd] = 1;
    auVar7[0xe] = 1;
    auVar7[0xf] = 1;
    auVar7 = pmaddubsw(*(undefined1 (*) [16])src_ptr,auVar7);
    auVar16[8] = 1;
    auVar16._0_8_ = 0x101010101010101;
    auVar16[9] = 1;
    auVar16[10] = 1;
    auVar16[0xb] = 1;
    auVar16[0xc] = 1;
    auVar16[0xd] = 1;
    auVar16[0xe] = 1;
    auVar16[0xf] = 1;
    auVar16 = pmaddubsw(*(undefined1 (*) [16])((long)src_ptr + 0x10),auVar16);
    auVar18[8] = 1;
    auVar18._0_8_ = 0x101010101010101;
    auVar18[9] = 1;
    auVar18[10] = 1;
    auVar18[0xb] = 1;
    auVar18[0xc] = 1;
    auVar18[0xd] = 1;
    auVar18[0xe] = 1;
    auVar18[0xf] = 1;
    auVar18 = pmaddubsw(*(undefined1 (*) [16])(*(undefined1 (*) [16])src_ptr + src_stride),auVar18);
    auVar19[8] = 1;
    auVar19._0_8_ = 0x101010101010101;
    auVar19[9] = 1;
    auVar19[10] = 1;
    auVar19[0xb] = 1;
    auVar19[0xc] = 1;
    auVar19[0xd] = 1;
    auVar19[0xe] = 1;
    auVar19[0xf] = 1;
    auVar21 = pmaddubsw(*(undefined1 (*) [16])
                         (*(undefined1 (*) [16])((long)src_ptr + 0x10) + src_stride),auVar19);
    auVar20[8] = 1;
    auVar20._0_8_ = 0x101010101010101;
    auVar20[9] = 1;
    auVar20[10] = 1;
    auVar20[0xb] = 1;
    auVar20[0xc] = 1;
    auVar20[0xd] = 1;
    auVar20[0xe] = 1;
    auVar20[0xf] = 1;
    auVar19 = pmaddubsw(*(undefined1 (*) [16])(*(undefined1 (*) [16])src_ptr + src_stride * 2),
                        auVar20);
    auVar22[8] = 1;
    auVar22._0_8_ = 0x101010101010101;
    auVar22[9] = 1;
    auVar22[10] = 1;
    auVar22[0xb] = 1;
    auVar22[0xc] = 1;
    auVar22[0xd] = 1;
    auVar22[0xe] = 1;
    auVar22[0xf] = 1;
    auVar22 = pmaddubsw(*(undefined1 (*) [16])
                         (*(undefined1 (*) [16])((long)src_ptr + 0x10) + src_stride * 2),auVar22);
    puVar3 = *(undefined1 (*) [16])src_ptr;
    pauVar4 = (undefined1 (*) [16])((long)src_ptr + 0x10);
    src_ptr = (uint8_t *)((long)src_ptr + 0x20);
    auVar23[8] = 1;
    auVar23._0_8_ = 0x101010101010101;
    auVar23[9] = 1;
    auVar23[10] = 1;
    auVar23[0xb] = 1;
    auVar23[0xc] = 1;
    auVar23[0xd] = 1;
    auVar23[0xe] = 1;
    auVar23[0xf] = 1;
    auVar20 = pmaddubsw(*(undefined1 (*) [16])(puVar3 + src_stride * 3),auVar23);
    auVar2[8] = 1;
    auVar2._0_8_ = 0x101010101010101;
    auVar2[9] = 1;
    auVar2[10] = 1;
    auVar2[0xb] = 1;
    auVar2[0xc] = 1;
    auVar2[0xd] = 1;
    auVar2[0xe] = 1;
    auVar2[0xf] = 1;
    auVar23 = pmaddubsw(*(undefined1 (*) [16])(*pauVar4 + src_stride * 3),auVar2);
    auVar8._0_2_ = auVar7._0_2_ + auVar18._0_2_ + auVar19._0_2_ + auVar20._0_2_;
    auVar8._2_2_ = auVar7._2_2_ + auVar18._2_2_ + auVar19._2_2_ + auVar20._2_2_;
    auVar8._4_2_ = auVar7._4_2_ + auVar18._4_2_ + auVar19._4_2_ + auVar20._4_2_;
    auVar8._6_2_ = auVar7._6_2_ + auVar18._6_2_ + auVar19._6_2_ + auVar20._6_2_;
    auVar8._8_2_ = auVar7._8_2_ + auVar18._8_2_ + auVar19._8_2_ + auVar20._8_2_;
    auVar8._10_2_ = auVar7._10_2_ + auVar18._10_2_ + auVar19._10_2_ + auVar20._10_2_;
    auVar8._12_2_ = auVar7._12_2_ + auVar18._12_2_ + auVar19._12_2_ + auVar20._12_2_;
    auVar8._14_2_ = auVar7._14_2_ + auVar18._14_2_ + auVar19._14_2_ + auVar20._14_2_;
    auVar17._0_2_ = auVar16._0_2_ + auVar21._0_2_ + auVar22._0_2_ + auVar23._0_2_;
    auVar17._2_2_ = auVar16._2_2_ + auVar21._2_2_ + auVar22._2_2_ + auVar23._2_2_;
    auVar17._4_2_ = auVar16._4_2_ + auVar21._4_2_ + auVar22._4_2_ + auVar23._4_2_;
    auVar17._6_2_ = auVar16._6_2_ + auVar21._6_2_ + auVar22._6_2_ + auVar23._6_2_;
    auVar17._8_2_ = auVar16._8_2_ + auVar21._8_2_ + auVar22._8_2_ + auVar23._8_2_;
    auVar17._10_2_ = auVar16._10_2_ + auVar21._10_2_ + auVar22._10_2_ + auVar23._10_2_;
    auVar17._12_2_ = auVar16._12_2_ + auVar21._12_2_ + auVar22._12_2_ + auVar23._12_2_;
    auVar17._14_2_ = auVar16._14_2_ + auVar21._14_2_ + auVar22._14_2_ + auVar23._14_2_;
    auVar7 = phaddw(auVar8,auVar17);
    uVar6 = (ushort)(auVar7._0_2_ + auVar24._0_2_) >> 4;
    uVar9 = (ushort)(auVar7._2_2_ + auVar24._2_2_) >> 4;
    uVar10 = (ushort)(auVar7._4_2_ + auVar24._4_2_) >> 4;
    uVar11 = (ushort)(auVar7._6_2_ + auVar24._6_2_) >> 4;
    uVar12 = (ushort)(auVar7._8_2_ + auVar24._8_2_) >> 4;
    uVar13 = (ushort)(auVar7._10_2_ + auVar24._10_2_) >> 4;
    uVar14 = (ushort)(auVar7._12_2_ + auVar24._12_2_) >> 4;
    uVar15 = (ushort)(auVar7._14_2_ + auVar24._14_2_) >> 4;
    *(ulong *)dst_ptr =
         CONCAT17((uVar15 != 0) * (uVar15 < 0x100) * (char)uVar15 - (0xff < uVar15),
                  CONCAT16((uVar14 != 0) * (uVar14 < 0x100) * (char)uVar14 - (0xff < uVar14),
                           CONCAT15((uVar13 != 0) * (uVar13 < 0x100) * (char)uVar13 -
                                    (0xff < uVar13),
                                    CONCAT14((uVar12 != 0) * (uVar12 < 0x100) * (char)uVar12 -
                                             (0xff < uVar12),
                                             CONCAT13((uVar11 != 0) * (uVar11 < 0x100) *
                                                      (char)uVar11 - (0xff < uVar11),
                                                      CONCAT12((uVar10 != 0) * (uVar10 < 0x100) *
                                                               (char)uVar10 - (0xff < uVar10),
                                                               CONCAT11((uVar9 != 0) *
                                                                        (uVar9 < 0x100) *
                                                                        (char)uVar9 - (0xff < uVar9)
                                                                        ,(uVar6 != 0) *
                                                                         (uVar6 < 0x100) *
                                                                         (char)uVar6 -
                                                                         (0xff < uVar6))))))));
    dst_ptr = dst_ptr + 8;
    iVar5 = dst_width + -8;
    bVar1 = 7 < dst_width;
    dst_width = iVar5;
  } while (iVar5 != 0 && bVar1);
  return;
}

Assistant:

void ScaleRowDown4Box_SSSE3(const uint8_t* src_ptr,
                            ptrdiff_t src_stride,
                            uint8_t* dst_ptr,
                            int dst_width) {
  intptr_t stridex3;
  asm volatile(
      "pcmpeqb     %%xmm4,%%xmm4                 \n"
      "psrlw       $0xf,%%xmm4                   \n"
      "movdqa      %%xmm4,%%xmm5                 \n"
      "packuswb    %%xmm4,%%xmm4                 \n"
      "psllw       $0x3,%%xmm5                   \n"
      "lea         0x00(%4,%4,2),%3              \n"

      LABELALIGN
      "1:                                        \n"
      "movdqu      (%0),%%xmm0                   \n"
      "movdqu      0x10(%0),%%xmm1               \n"
      "movdqu      0x00(%0,%4,1),%%xmm2          \n"
      "movdqu      0x10(%0,%4,1),%%xmm3          \n"
      "pmaddubsw   %%xmm4,%%xmm0                 \n"
      "pmaddubsw   %%xmm4,%%xmm1                 \n"
      "pmaddubsw   %%xmm4,%%xmm2                 \n"
      "pmaddubsw   %%xmm4,%%xmm3                 \n"
      "paddw       %%xmm2,%%xmm0                 \n"
      "paddw       %%xmm3,%%xmm1                 \n"
      "movdqu      0x00(%0,%4,2),%%xmm2          \n"
      "movdqu      0x10(%0,%4,2),%%xmm3          \n"
      "pmaddubsw   %%xmm4,%%xmm2                 \n"
      "pmaddubsw   %%xmm4,%%xmm3                 \n"
      "paddw       %%xmm2,%%xmm0                 \n"
      "paddw       %%xmm3,%%xmm1                 \n"
      "movdqu      0x00(%0,%3,1),%%xmm2          \n"
      "movdqu      0x10(%0,%3,1),%%xmm3          \n"
      "lea         0x20(%0),%0                   \n"
      "pmaddubsw   %%xmm4,%%xmm2                 \n"
      "pmaddubsw   %%xmm4,%%xmm3                 \n"
      "paddw       %%xmm2,%%xmm0                 \n"
      "paddw       %%xmm3,%%xmm1                 \n"
      "phaddw      %%xmm1,%%xmm0                 \n"
      "paddw       %%xmm5,%%xmm0                 \n"
      "psrlw       $0x4,%%xmm0                   \n"
      "packuswb    %%xmm0,%%xmm0                 \n"
      "movq        %%xmm0,(%1)                   \n"
      "lea         0x8(%1),%1                    \n"
      "sub         $0x8,%2                       \n"
      "jg          1b                            \n"
      : "+r"(src_ptr),               // %0
        "+r"(dst_ptr),               // %1
        "+r"(dst_width),             // %2
        "=&r"(stridex3)              // %3
      : "r"((intptr_t)(src_stride))  // %4
      : "memory", "cc", "xmm0", "xmm1", "xmm2", "xmm3", "xmm4", "xmm5");
}